

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detectionoutput.cpp
# Opt level: O0

int __thiscall
ncnn::DetectionOutput::forward
          (DetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  value_type vVar1;
  __normal_iterator<const_ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
  __last;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> __last_00;
  ulong uVar2;
  bool bVar3;
  float *pfVar4;
  size_type sVar5;
  reference pvVar6;
  reference this_00;
  reference pvVar7;
  reference pvVar8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  double dVar9;
  float *outptr;
  float score_2;
  BBoxRect *r;
  int i_3;
  Mat *top_blob;
  int num_detected;
  vector<float,_std::allocator<float>_> *class_bbox_scores_1;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *class_bbox_rects_1;
  int i_2;
  vector<float,_std::allocator<float>_> bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  size_t z;
  size_t j_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  BBoxRect c;
  float *bbox_1;
  float score_1;
  int j;
  vector<float,_std::allocator<float>_> class_bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> class_bbox_rects;
  int i_1;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  all_class_bbox_scores;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  all_class_bbox_rects;
  float bbox_h;
  float bbox_w;
  float bbox_cy;
  float bbox_cx;
  float pb_cy;
  float pb_cx;
  float pb_h;
  float pb_w;
  float *bbox;
  float *var;
  float *pb;
  float *loc;
  float score;
  int i;
  float *variance_ptr;
  float *priorbox_ptr;
  float *location_ptr;
  Mat bboxes;
  int num_class_copy;
  int num_prior;
  bool mxnet_ssd_style;
  Mat *priorbox;
  Mat *confidence;
  Mat *location;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc94;
  int iVar10;
  value_type *in_stack_fffffffffffffc98;
  iterator in_stack_fffffffffffffca0;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *in_stack_fffffffffffffca8;
  iterator in_stack_fffffffffffffcb0;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  int in_stack_fffffffffffffcdc;
  __normal_iterator<const_ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
  in_stack_fffffffffffffce0;
  const_iterator in_stack_fffffffffffffce8;
  float local_30c;
  float *local_2e8;
  float local_2d4;
  float *in_stack_fffffffffffffd30;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *in_stack_fffffffffffffd38;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *bboxes_00;
  int local_298;
  int local_294;
  int local_26c;
  int local_1f4;
  vector<float,_std::allocator<float>_> local_1f0;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> local_1d8;
  size_type local_1c0;
  ulong local_1b8;
  vector<float,_std::allocator<float>_> local_1b0;
  float local_194;
  float local_190;
  float local_18c;
  float local_188;
  int local_184;
  BBoxRect *local_180;
  float local_178;
  int local_174;
  vector<float,_std::allocator<float>_> local_170;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> local_158;
  int local_13c;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_138;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  local_120;
  float local_108;
  float local_104;
  float local_100;
  float local_fc;
  float local_f8;
  float local_f4;
  float local_f0;
  float local_ec;
  float *local_e8;
  float *local_e0;
  float *local_d8;
  float *local_d0;
  float local_c8;
  int local_c4;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *local_c0;
  float *local_b8;
  float *local_b0;
  undefined4 local_a8;
  Mat local_98;
  int local_4c;
  int local_48;
  byte local_41;
  const_reference local_40;
  const_reference local_38;
  const_reference local_30;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_38 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,1);
  local_40 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,2);
  local_41 = *(int *)(in_RDI + 0xd0) == -0xe9;
  if ((bool)local_41) {
    local_294 = local_40->h;
  }
  else {
    local_294 = local_40->w / 4;
  }
  local_48 = local_294;
  if ((bool)local_41) {
    local_298 = local_38->h;
  }
  else {
    local_298 = *(int *)(in_RDI + 0xd0);
  }
  local_4c = local_298;
  ncnn::Mat::Mat(&local_98);
  ncnn::Mat::create((Mat *)in_stack_fffffffffffffcb0._M_current,
                    (int)((ulong)in_stack_fffffffffffffca8 >> 0x20),(int)in_stack_fffffffffffffca8,
                    (size_t)in_stack_fffffffffffffca0._M_current,
                    (Allocator *)in_stack_fffffffffffffc98);
  bVar3 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
  if (bVar3) {
    local_4 = -100;
    local_a8 = 1;
  }
  else {
    local_b0 = ncnn::Mat::operator_cast_to_float_(local_30);
    local_b8 = ncnn::Mat::row(local_40,0);
    if ((local_41 & 1) == 0) {
      in_stack_fffffffffffffd38 =
           (vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)ncnn::Mat::row(local_40,1);
      bboxes_00 = in_stack_fffffffffffffd38;
    }
    else {
      bboxes_00 = (vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)0x0;
    }
    local_c0 = bboxes_00;
    for (local_c4 = 0; local_c4 < local_48; local_c4 = local_c4 + 1) {
      if ((local_41 & 1) == 0) {
        pfVar4 = ncnn::Mat::operator[](local_38,(long)(local_c4 * local_4c));
        local_2d4 = *pfVar4;
      }
      else {
        in_stack_fffffffffffffd30 = ncnn::Mat::operator[](local_38,(long)local_c4);
        local_2d4 = *in_stack_fffffffffffffd30;
      }
      local_c8 = local_2d4;
      if (local_2d4 < 1.0 - *(float *)(in_RDI + 0xe0)) {
        local_d0 = local_b0 + (local_c4 << 2);
        local_d8 = local_b8 + (local_c4 << 2);
        if (local_c0 == (vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)0x0) {
          local_2e8 = (float *)(in_RDI + 0xe4);
        }
        else {
          local_2e8 = (float *)((long)&(local_c0->
                                       super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                       )._M_impl.super__Vector_impl_data._M_start +
                               (long)(local_c4 << 2) * 4);
        }
        local_e0 = local_2e8;
        local_e8 = ncnn::Mat::row(&local_98,local_c4);
        local_ec = local_d8[2] - *local_d8;
        local_f0 = local_d8[3] - local_d8[1];
        local_f4 = (*local_d8 + local_d8[2]) * 0.5;
        local_f8 = (local_d8[1] + local_d8[3]) * 0.5;
        local_fc = *local_e0 * *local_d0 * local_ec + local_f4;
        local_100 = local_e0[1] * local_d0[1] * local_f0 + local_f8;
        dVar9 = std::exp((double)(ulong)(uint)(local_e0[2] * local_d0[2]));
        local_104 = SUB84(dVar9,0) * local_ec;
        dVar9 = std::exp((double)(ulong)(uint)(local_e0[3] * local_d0[3]));
        local_108 = SUB84(dVar9,0) * local_f0;
        *local_e8 = local_fc - local_104 * 0.5;
        local_e8[1] = local_100 - local_108 * 0.5;
        local_e8[2] = local_fc + local_104 * 0.5;
        local_e8[3] = local_100 + local_108 * 0.5;
      }
    }
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::vector((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
              *)0x6adb41);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)0x6adb4e);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::resize((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
              *)in_stack_fffffffffffffcb0._M_current,(size_type)in_stack_fffffffffffffca8);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)in_stack_fffffffffffffcb0._M_current,(size_type)in_stack_fffffffffffffca8);
    for (local_13c = 1; local_13c < local_4c; local_13c = local_13c + 1) {
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::vector
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)0x6adba5);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)0x6adbb2);
      for (local_174 = 0; local_174 < local_48; local_174 = local_174 + 1) {
        if ((local_41 & 1) == 0) {
          in_stack_fffffffffffffce8._M_current =
               (BBoxRect *)ncnn::Mat::operator[](local_38,(long)(local_174 * local_4c + local_13c));
          local_30c = (in_stack_fffffffffffffce8._M_current)->xmin;
        }
        else {
          pfVar4 = ncnn::Mat::operator[](local_38,(long)(local_13c * local_48 + local_174));
          local_30c = *pfVar4;
        }
        local_178 = local_30c;
        if (*(float *)(in_RDI + 0xe0) <= local_30c && local_30c != *(float *)(in_RDI + 0xe0)) {
          in_stack_fffffffffffffce0._M_current = (BBoxRect *)ncnn::Mat::row(&local_98,local_174);
          local_194 = (in_stack_fffffffffffffce0._M_current)->xmin;
          local_190 = (in_stack_fffffffffffffce0._M_current)->ymin;
          local_18c = (in_stack_fffffffffffffce0._M_current)->xmax;
          local_188 = (in_stack_fffffffffffffce0._M_current)->ymax;
          local_184 = local_13c;
          local_180 = in_stack_fffffffffffffce0._M_current;
          std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                    ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                     in_stack_fffffffffffffca0._M_current,in_stack_fffffffffffffc98);
          std::vector<float,_std::allocator<float>_>::push_back
                    ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffca0._M_current,
                     &in_stack_fffffffffffffc98->xmin);
        }
      }
      qsort_descent_inplace<ncnn::BBoxRect>
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffffca0._M_current,
                 (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffc98);
      in_stack_fffffffffffffcdc = *(int *)(in_RDI + 0xd8);
      sVar5 = std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::size(&local_158);
      if (in_stack_fffffffffffffcdc < (int)sVar5) {
        std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::resize
                  ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                   in_stack_fffffffffffffcb0._M_current,(size_type)in_stack_fffffffffffffca8);
        std::vector<float,_std::allocator<float>_>::resize
                  ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffcb0._M_current,
                   (size_type)in_stack_fffffffffffffca8);
      }
      in_stack_fffffffffffffcd0 = &local_1b0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x6ade22);
      nms_sorted_bboxes(bboxes_00,
                        (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffd38,(float)((ulong)in_stack_fffffffffffffd30 >> 0x20))
      ;
      for (local_1b8 = 0; uVar2 = local_1b8,
          sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b0),
          uVar2 < sVar5; local_1b8 = local_1b8 + 1) {
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b0,
                            local_1b8);
        local_1c0 = *pvVar6;
        std::
        vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
        ::operator[](&local_120,(long)local_13c);
        std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::operator[]
                  (&local_158,local_1c0);
        std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                  ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                   in_stack_fffffffffffffca0._M_current,in_stack_fffffffffffffc98);
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::operator[](&local_138,(long)local_13c);
        std::vector<float,_std::allocator<float>_>::operator[](&local_170,local_1c0);
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffca0._M_current,
                   &in_stack_fffffffffffffc98->xmin);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffffca0._M_current);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffca0._M_current);
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~vector
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffffca0._M_current);
    }
    std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::vector
              ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)0x6adfc0);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x6adfcd);
    for (local_1f4 = 1; local_1f4 < local_4c; local_1f4 = local_1f4 + 1) {
      std::
      vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ::operator[](&local_120,(long)local_1f4);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::operator[](&local_138,(long)local_1f4);
      in_stack_fffffffffffffca8 = &local_1d8;
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::end
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffffc88);
      __gnu_cxx::
      __normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>
      ::__normal_iterator<ncnn::BBoxRect*>
                ((__normal_iterator<const_ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
                  *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                 (__normal_iterator<ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
                  *)in_stack_fffffffffffffc88);
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::begin
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffffc88);
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::end
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffffc88);
      __last._M_current._4_4_ = in_stack_fffffffffffffcdc;
      __last._M_current._0_4_ = in_stack_fffffffffffffcd8;
      in_stack_fffffffffffffcb0 =
           std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
           insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>,void>
                     ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                      in_stack_fffffffffffffcd0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                      __last);
      in_stack_fffffffffffffc98 = (value_type *)&local_1f0;
      std::vector<float,_std::allocator<float>_>::end(in_stack_fffffffffffffc88);
      __gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>::
      __normal_iterator<float*>
                ((__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *)
                 CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                 (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                 in_stack_fffffffffffffc88);
      std::vector<float,_std::allocator<float>_>::begin(in_stack_fffffffffffffc88);
      std::vector<float,_std::allocator<float>_>::end(in_stack_fffffffffffffc88);
      __last_00._M_current._4_4_ = in_stack_fffffffffffffcdc;
      __last_00._M_current._0_4_ = in_stack_fffffffffffffcd8;
      in_stack_fffffffffffffca0 =
           std::vector<float,std::allocator<float>>::
           insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,void>
                     (in_stack_fffffffffffffcd0,(const_iterator)in_stack_fffffffffffffce8._M_current
                      ,(__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
                        )in_stack_fffffffffffffce0._M_current,__last_00);
    }
    qsort_descent_inplace<ncnn::BBoxRect>
              ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
               in_stack_fffffffffffffca0._M_current,
               (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffc98);
    iVar10 = *(int *)(in_RDI + 0xdc);
    sVar5 = std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::size(&local_1d8);
    if (iVar10 < (int)sVar5) {
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::resize
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffffcb0._M_current,(size_type)in_stack_fffffffffffffca8);
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffcb0._M_current,
                 (size_type)in_stack_fffffffffffffca8);
    }
    sVar5 = std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::size(&local_1d8);
    if ((int)sVar5 == 0) {
      local_4 = 0;
    }
    else {
      this_00 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
      ncnn::Mat::create((Mat *)in_stack_fffffffffffffcb0._M_current,
                        (int)((ulong)in_stack_fffffffffffffca8 >> 0x20),
                        (int)in_stack_fffffffffffffca8,(size_t)in_stack_fffffffffffffca0._M_current,
                        (Allocator *)in_stack_fffffffffffffc98);
      bVar3 = ncnn::Mat::empty((Mat *)CONCAT44(iVar10,in_stack_fffffffffffffc90));
      if (bVar3) {
        local_4 = -100;
      }
      else {
        for (local_26c = 0; local_26c < (int)sVar5; local_26c = local_26c + 1) {
          pvVar7 = std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::operator[]
                             (&local_1d8,(long)local_26c);
          pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                             (&local_1f0,(long)local_26c);
          vVar1 = *pvVar8;
          pfVar4 = ncnn::Mat::row(this_00,local_26c);
          *pfVar4 = (float)pvVar7->label;
          pfVar4[1] = vVar1;
          pfVar4[2] = pvVar7->xmin;
          pfVar4[3] = pvVar7->ymin;
          pfVar4[4] = pvVar7->xmax;
          pfVar4[5] = pvVar7->ymax;
        }
        local_4 = 0;
      }
    }
    local_a8 = 1;
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffca0._M_current);
    std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~vector
              ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
               in_stack_fffffffffffffca0._M_current);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               *)in_stack_fffffffffffffca0._M_current);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::~vector((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
               *)in_stack_fffffffffffffca0._M_current);
  }
  ncnn::Mat::~Mat((Mat *)0x6ae467);
  return local_4;
}

Assistant:

int DetectionOutput::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& location = bottom_blobs[0];
    const Mat& confidence = bottom_blobs[1];
    const Mat& priorbox = bottom_blobs[2];

    bool mxnet_ssd_style = num_class == -233;

    // mxnet-ssd _contrib_MultiBoxDetection
    const int num_prior = mxnet_ssd_style ? priorbox.h : priorbox.w / 4;

    int num_class_copy = mxnet_ssd_style ? confidence.h : num_class;

    // apply location with priorbox
    Mat bboxes;
    bboxes.create(4, num_prior, 4u, opt.workspace_allocator);
    if (bboxes.empty())
        return -100;

    const float* location_ptr = location;
    const float* priorbox_ptr = priorbox.row(0);
    const float* variance_ptr = mxnet_ssd_style ? 0 : priorbox.row(1);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_prior; i++)
    {
        // if score of background class is larger than confidence threshold
        float score = mxnet_ssd_style ? confidence[i] : confidence[i * num_class_copy];
        if (score >= (1.0 - confidence_threshold))
        {
            continue;
        }
        const float* loc = location_ptr + i * 4;
        const float* pb = priorbox_ptr + i * 4;
        const float* var = variance_ptr ? variance_ptr + i * 4 : variances;

        float* bbox = bboxes.row(i);

        // CENTER_SIZE
        float pb_w = pb[2] - pb[0];
        float pb_h = pb[3] - pb[1];
        float pb_cx = (pb[0] + pb[2]) * 0.5f;
        float pb_cy = (pb[1] + pb[3]) * 0.5f;

        float bbox_cx = var[0] * loc[0] * pb_w + pb_cx;
        float bbox_cy = var[1] * loc[1] * pb_h + pb_cy;
        float bbox_w = static_cast<float>(exp(var[2] * loc[2]) * pb_w);
        float bbox_h = static_cast<float>(exp(var[3] * loc[3]) * pb_h);

        bbox[0] = bbox_cx - bbox_w * 0.5f;
        bbox[1] = bbox_cy - bbox_h * 0.5f;
        bbox[2] = bbox_cx + bbox_w * 0.5f;
        bbox[3] = bbox_cy + bbox_h * 0.5f;
    }

    // sort and nms for each class
    std::vector<std::vector<BBoxRect> > all_class_bbox_rects;
    std::vector<std::vector<float> > all_class_bbox_scores;
    all_class_bbox_rects.resize(num_class_copy);
    all_class_bbox_scores.resize(num_class_copy);

    // start from 1 to ignore background class
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 1; i < num_class_copy; i++)
    {
        // filter by confidence_threshold
        std::vector<BBoxRect> class_bbox_rects;
        std::vector<float> class_bbox_scores;

        for (int j = 0; j < num_prior; j++)
        {
            // prob data layout
            // caffe-ssd = num_class x num_prior
            // mxnet-ssd = num_prior x num_class
            float score = mxnet_ssd_style ? confidence[i * num_prior + j] : confidence[j * num_class_copy + i];

            if (score > confidence_threshold)
            {
                const float* bbox = bboxes.row(j);
                BBoxRect c = {bbox[0], bbox[1], bbox[2], bbox[3], i};
                class_bbox_rects.push_back(c);
                class_bbox_scores.push_back(score);
            }
        }

        // sort inplace
        qsort_descent_inplace(class_bbox_rects, class_bbox_scores);

        // keep nms_top_k
        if (nms_top_k < (int)class_bbox_rects.size())
        {
            class_bbox_rects.resize(nms_top_k);
            class_bbox_scores.resize(nms_top_k);
        }

        // apply nms
        std::vector<size_t> picked;
        nms_sorted_bboxes(class_bbox_rects, picked, nms_threshold);

        // select
        for (size_t j = 0; j < picked.size(); j++)
        {
            size_t z = picked[j];
            all_class_bbox_rects[i].push_back(class_bbox_rects[z]);
            all_class_bbox_scores[i].push_back(class_bbox_scores[z]);
        }
    }

    // gather all class
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (int i = 1; i < num_class_copy; i++)
    {
        const std::vector<BBoxRect>& class_bbox_rects = all_class_bbox_rects[i];
        const std::vector<float>& class_bbox_scores = all_class_bbox_scores[i];

        bbox_rects.insert(bbox_rects.end(), class_bbox_rects.begin(), class_bbox_rects.end());
        bbox_scores.insert(bbox_scores.end(), class_bbox_scores.begin(), class_bbox_scores.end());
    }

    // global sort inplace
    qsort_descent_inplace(bbox_rects, bbox_scores);

    // keep_top_k
    if (keep_top_k < (int)bbox_rects.size())
    {
        bbox_rects.resize(keep_top_k);
        bbox_scores.resize(keep_top_k);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label);
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}